

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O2

int cuddSymmSifting(DdManager *table,int lower,int upper)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *__ptr;
  void *__base;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int symvars;
  undefined4 uStack_44;
  long local_40;
  int symgroups;
  
  uVar1 = table->size;
  __size = (long)(int)uVar1 * 4;
  __ptr = (int *)malloc(__size);
  entry = __ptr;
  if (__ptr == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    __base = (void *)0x0;
    goto LAB_0075005b;
  }
  __base = malloc(__size);
  if (__base != (void *)0x0) {
    uVar4 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      __ptr[uVar4] = table->subtables[table->perm[uVar4]].keys;
      *(int *)((long)__base + uVar4 * 4) = (int)uVar4;
    }
    qsort(__base,(long)(int)uVar1,4,ddSymmUniqueCompare);
    lVar5 = (long)lower;
    lVar7 = lVar5 * 0x38 + 0x1c;
    for (; lVar5 <= upper; lVar5 = lVar5 + 1) {
      *(int *)((long)&table->subtables->nodelist + lVar7) = (int)lVar5;
      lVar7 = lVar7 + 0x38;
    }
    lVar5 = 0;
    do {
      uVar2 = table->siftMaxVar;
      if ((int)uVar1 < table->siftMaxVar) {
        uVar2 = uVar1;
      }
      if (((int)uVar2 <= lVar5) || (table->siftMaxSwap <= ddTotalNumberSwapping)) {
LAB_00750001:
        free(__base);
        if (entry != (int *)0x0) {
          free(entry);
          entry = (int *)0x0;
        }
        ddSymmSummary(table,lower,upper,&symvars,&symgroups);
        return symvars + 1;
      }
      if (table->TimeStop != 0) {
        iVar3 = clock_gettime(3,(timespec *)&symvars);
        lVar7 = -1;
        if (-1 < iVar3) {
          lVar7 = local_40 / 1000 + CONCAT44(uStack_44,symvars) * 1000000;
        }
        if (table->TimeStop < lVar7) goto LAB_00750001;
      }
      uVar2 = table->perm[*(int *)((long)__base + lVar5 * 4)];
      if ((((int)uVar2 <= upper && lower <= (int)uVar2) &&
          (table->subtables[(int)uVar2].next == uVar2)) &&
         (iVar3 = ddSymmSiftingAux(table,uVar2,lower,upper), iVar3 == 0)) goto LAB_00750074;
      lVar5 = lVar5 + 1;
    } while( true );
  }
  table->errorCode = CUDD_MEMORY_OUT;
  goto LAB_0075004b;
LAB_00750074:
  __ptr = entry;
  if (entry == (int *)0x0) goto LAB_0075005b;
LAB_0075004b:
  free(__ptr);
  entry = (int *)0x0;
LAB_0075005b:
  free(__base);
  return 0;
}

Assistant:

int
cuddSymmSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         size;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
#ifdef DD_STATS
    int         previousSize;
#endif

    size = table->size;

    /* Find order in which to sift variables. */
    var = NULL;
    entry = ABC_ALLOC(int,size);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingOutOfMem;
    }
    var = ABC_ALLOC(int,size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddSymmSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->perm[i];
        entry[i] = table->subtables[x].keys;
        var[i] = i;
    }

    qsort((void *)var,(size_t)size,sizeof(int),(DD_QSFP)ddSymmUniqueCompare);

    /* Initialize the symmetry of each subtable to itself. */
    for (i = lower; i <= upper; i++) {
        table->subtables[i].next = i;
    }

    for (i = 0; i < ddMin(table->siftMaxVar,size); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        // enable timeout during variable reodering - alanmi 2/13/11
        if ( table->TimeStop && Abc_Clock() > table->TimeStop )
            break;
        x = table->perm[var[i]];
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
        if (x < lower || x > upper) continue;
        if (table->subtables[x].next == (unsigned) x) {
            result = ddSymmSiftingAux(table,x,lower,upper);
            if (!result) goto ddSymmSiftingOutOfMem;
#ifdef DD_STATS
            if (table->keys < (unsigned) previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > (unsigned) previousSize +
                       table->isolated) {
                (void) fprintf(table->out,"+"); /* should never happen */
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    ABC_FREE(var);
    ABC_FREE(entry);

    ddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out, "\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out, "#:G_SIFTING %8d: symmetric groups",
                   symgroups);
#endif

    return(1+symvars);

ddSymmSiftingOutOfMem:

    if (entry != NULL) ABC_FREE(entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}